

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

value_type * __thiscall
QList<QSocks5RevivedDatagram>::takeFirst
          (value_type *__return_storage_ptr__,QList<QSocks5RevivedDatagram> *this)

{
  qsizetype qVar1;
  QHostAddressPrivate *pQVar2;
  Data *pDVar3;
  char *pcVar4;
  iterator iVar5;
  
  *(undefined1 **)&__return_storage_ptr__->port = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->address).d.d.ptr = (QHostAddressPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  iVar5 = begin(this);
  pDVar3 = ((iVar5.i)->data).d.d;
  pcVar4 = ((iVar5.i)->data).d.ptr;
  ((iVar5.i)->data).d.d = (Data *)0x0;
  ((iVar5.i)->data).d.ptr = (char *)0x0;
  (__return_storage_ptr__->data).d.d = pDVar3;
  (__return_storage_ptr__->data).d.ptr = pcVar4;
  qVar1 = ((iVar5.i)->data).d.size;
  ((iVar5.i)->data).d.size = 0;
  (__return_storage_ptr__->data).d.size = qVar1;
  pQVar2 = ((iVar5.i)->address).d.d.ptr;
  ((iVar5.i)->address).d.d.ptr = (QHostAddressPrivate *)0x0;
  (__return_storage_ptr__->address).d.d.ptr = pQVar2;
  __return_storage_ptr__->port = (iVar5.i)->port;
  QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::eraseFirst
            ((QGenericArrayOps<QSocks5RevivedDatagram> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }